

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::
SmallVectorBase<std::variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>_>
::cleanup(SmallVectorBase<std::variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>_>
          *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  __destroy_fn *unaff_retaddr;
  
  std::ranges::__destroy_fn::
  operator()<slang::SmallVectorBase<std::variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>_>_&>
            (unaff_retaddr,this);
  bVar1 = isSmall(this);
  if (!bVar1) {
    operator_delete((void *)0x5f312a);
  }
  return;
}

Assistant:

void cleanup() {
        std::ranges::destroy(*this);
        if (!isSmall())
            ::operator delete(data_);
    }